

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QDockWidgetGroupLayout::setGeometry(QDockWidgetGroupLayout *this,QRect *r)

{
  QDockAreaLayoutInfo *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  QWidgetResizeHandler *this_01;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  bool bVar7;
  int iVar8;
  QWidget *parent;
  
  QDockWidgetGroupWindow::destroyOrHideIfEmpty
            (*(QDockWidgetGroupWindow **)(*(long *)&(this->super_QLayout).field_0x8 + 0x10));
  this_00 = &this->layoutState;
  bVar7 = QDockAreaLayoutInfo::isEmpty(this_00);
  if (bVar7) {
    return;
  }
  iVar8 = frameWidth(this);
  parent = QLayout::parentWidget(&this->super_QLayout);
  QDockAreaLayoutInfo::reparentWidgets(this_00,parent);
  iVar1 = (r->y1).m_i;
  iVar2 = (r->x2).m_i;
  iVar3 = (r->y2).m_i;
  (this->layoutState).rect.x1 = (Representation)((r->x1).m_i + iVar8);
  (this->layoutState).rect.y1 = (Representation)(iVar1 + iVar8);
  (this->layoutState).rect.x2 = (Representation)(iVar2 - iVar8);
  (this->layoutState).rect.y2 = (Representation)(iVar3 - iVar8);
  QDockAreaLayoutInfo::fitItems(this_00);
  QDockAreaLayoutInfo::apply(this_00,false);
  if (((this->savedState).rect.x1.m_i <= (this->savedState).rect.x2.m_i) &&
     ((this->savedState).rect.y1.m_i <= (this->savedState).rect.y2.m_i)) {
    RVar4.m_i = (this->layoutState).rect.y1.m_i;
    RVar5.m_i = (this->layoutState).rect.x2.m_i;
    RVar6.m_i = (this->layoutState).rect.y2.m_i;
    (this->savedState).rect.x1 = (Representation)(this->layoutState).rect.x1.m_i;
    (this->savedState).rect.y1 = (Representation)RVar4.m_i;
    (this->savedState).rect.x2 = (Representation)RVar5.m_i;
    (this->savedState).rect.y2 = (Representation)RVar6.m_i;
  }
  this_01 = this->resizer;
  bVar7 = QDockWidgetGroupWindow::hasNativeDecos
                    (*(QDockWidgetGroupWindow **)(*(long *)&(this->super_QLayout).field_0x8 + 0x10))
  ;
  QWidgetResizeHandler::setEnabled((QWidgetResizeHandler *)this_01,!bVar7);
  return;
}

Assistant:

void setGeometry(const QRect&r) override
    {
        groupWindow()->destroyOrHideIfEmpty();
        QDockAreaLayoutInfo *li = dockAreaLayoutInfo();
        if (li->isEmpty())
            return;
        int fw = frameWidth();
#if QT_CONFIG(tabbar)
        li->reparentWidgets(parentWidget());
#endif
        li->rect = r.adjusted(fw, fw, -fw, -fw);
        li->fitItems();
        li->apply(false);
        if (savedState.rect.isValid())
            savedState.rect = li->rect;
        resizer->setEnabled(!nativeWindowDeco());
    }